

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::descriptor_unittest::LazilyBuildDependenciesTest_Type_Test::
~LazilyBuildDependenciesTest_Type_Test(LazilyBuildDependenciesTest_Type_Test *this)

{
  (this->super_LazilyBuildDependenciesTest).super_Test._vptr_Test =
       (_func_int **)&PTR__LazilyBuildDependenciesTest_018e9280;
  DescriptorPool::~DescriptorPool(&(this->super_LazilyBuildDependenciesTest).pool_);
  SimpleDescriptorDatabase::~SimpleDescriptorDatabase
            (&(this->super_LazilyBuildDependenciesTest).db_);
  testing::Test::~Test((Test *)this);
  operator_delete(this,0xf0);
  return;
}

Assistant:

TEST_F(LazilyBuildDependenciesTest, Type) {
  ParseProtoAndAddToDb(
      R"pb(
        name: 'foo.proto'
        package: 'proto2_unittest'
        dependency: 'message1.proto'
        dependency: 'message2.proto'
        dependency: 'enum1.proto'
        dependency: 'enum2.proto'
        message_type {
          name: 'Lazy'
          field {
            name: 'message1'
            number: 1
            label: LABEL_OPTIONAL
            type: TYPE_MESSAGE
            type_name: '.proto2_unittest.Message1'
          }
          field {
            name: 'message2'
            number: 1
            label: LABEL_OPTIONAL
            type: TYPE_MESSAGE
            type_name: '.proto2_unittest.Message2'
          }
          field {
            name: 'enum1'
            number: 1
            label: LABEL_OPTIONAL
            type: TYPE_ENUM
            type_name: '.proto2_unittest.Enum1'
          }
          field {
            name: 'enum2'
            number: 1
            label: LABEL_OPTIONAL
            type: TYPE_ENUM
            type_name: '.proto2_unittest.Enum2'
          }
        })pb");
  AddSimpleMessageProtoFileToDb("message1", "Message1");
  AddSimpleMessageProtoFileToDb("message2", "Message2");
  AddSimpleEnumProtoFileToDb("enum1", "Enum1", "ENUM1");
  AddSimpleEnumProtoFileToDb("enum2", "Enum2", "ENUM2");

  const FileDescriptor* file = pool_.FindFileByName("foo.proto");

  // Verify calling type() on a field that is a message type will _not_
  // build the type defined in another file.
  EXPECT_FALSE(pool_.InternalIsFileLoaded("message1.proto"));
  const Descriptor* desc = file->FindMessageTypeByName("Lazy");
  EXPECT_TRUE(desc != nullptr);
  const FieldDescriptor* field = desc->FindFieldByName("message1");
  EXPECT_TRUE(field != nullptr);
  EXPECT_EQ(field->type(), FieldDescriptor::TYPE_MESSAGE);
  EXPECT_FALSE(pool_.InternalIsFileLoaded("message1.proto"));

  // Verify calling cpp_type() on a field that is a message type will _not_
  // build the type defined in another file.
  EXPECT_FALSE(pool_.InternalIsFileLoaded("message2.proto"));
  field = desc->FindFieldByName("message2");
  EXPECT_TRUE(field != nullptr);
  EXPECT_EQ(field->cpp_type(), FieldDescriptor::CPPTYPE_MESSAGE);
  EXPECT_FALSE(pool_.InternalIsFileLoaded("message2.proto"));

  // Verify calling type() on a field that is an enum type will _not_
  // build the type defined in another file.
  EXPECT_FALSE(pool_.InternalIsFileLoaded("enum1.proto"));
  field = desc->FindFieldByName("enum1");
  EXPECT_TRUE(field != nullptr);
  EXPECT_EQ(field->type(), FieldDescriptor::TYPE_ENUM);
  EXPECT_FALSE(pool_.InternalIsFileLoaded("enum1.proto"));

  // Verify calling cpp_type() on a field that is an enum type will _not_
  // build the type defined in another file.
  EXPECT_FALSE(pool_.InternalIsFileLoaded("enum2.proto"));
  field = desc->FindFieldByName("enum2");
  EXPECT_TRUE(field != nullptr);
  EXPECT_EQ(field->cpp_type(), FieldDescriptor::CPPTYPE_ENUM);
  EXPECT_FALSE(pool_.InternalIsFileLoaded("enum2.proto"));
}